

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseData<QList<QString>>::resolve<QList<QString>>
          (PromiseData<QList<QString>> *this,QList<QString> *value)

{
  __shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::make_shared<QList<QString>,QList<QString>>((QList<QString> *)&local_20);
  std::__shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x58),&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::setSettled
            ((PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }